

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int propagateConstants(Parse *pParse,Select *p)

{
  int extraout_EAX;
  int iVar1;
  int extraout_EAX_00;
  Walker w;
  Parse *local_80;
  undefined8 local_78;
  Expr **ppEStack_70;
  Walker local_68;
  
  local_80 = pParse;
  do {
    local_78._0_4_ = 0;
    local_78._4_4_ = 0;
    ppEStack_70 = (Expr **)0x0;
    findConstInWhere(((NameContext *)&local_80).pConst,p->pWhere);
    iVar1 = extraout_EAX;
    if ((int)local_78 != 0) {
      iVar1 = 0x17e804;
      local_68.xExprCallback = propagateConstantExprRewrite;
      local_68.xSelectCallback = sqlite3SelectWalkNoop;
      local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
      local_68.walkerDepth = 0;
      local_68.eCode = '\0';
      local_68._37_3_ = 0;
      local_68.pParse = pParse;
      local_68.u.pNC = ((NameContext *)&local_80).pNC;
      if (p->pWhere != (Expr *)0x0) {
        iVar1 = walkExpr(&local_68,p->pWhere);
      }
      if (ppEStack_70 != (Expr **)0x0) {
        sqlite3DbFreeNN(local_80->db,ppEStack_70);
        iVar1 = extraout_EAX_00;
      }
    }
  } while (local_78._4_4_ != 0);
  return iVar1;
}

Assistant:

static int propagateConstants(
  Parse *pParse,   /* The parsing context */
  Select *p        /* The query in which to propagate constants */
){
  WhereConst x;
  Walker w;
  int nChng = 0;
  x.pParse = pParse;
  do{
    x.nConst = 0;
    x.nChng = 0;
    x.apExpr = 0;
    findConstInWhere(&x, p->pWhere);
    if( x.nConst ){
      memset(&w, 0, sizeof(w));
      w.pParse = pParse;
      w.xExprCallback = propagateConstantExprRewrite;
      w.xSelectCallback = sqlite3SelectWalkNoop;
      w.xSelectCallback2 = 0;
      w.walkerDepth = 0;
      w.u.pConst = &x;
      sqlite3WalkExpr(&w, p->pWhere);
      sqlite3DbFree(x.pParse->db, x.apExpr);
      nChng += x.nChng;
    }
  }while( x.nChng );  
  return nChng;
}